

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::~tag_t(tag_t<cfgfile::string_trait_t> *this)

{
  code *pcVar1;
  tag_t<cfgfile::string_trait_t> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~tag_t()
	{
	}